

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.cpp
# Opt level: O1

void __thiscall
ConsoleListener::person_changed(ConsoleListener *this,Person *param_1,string *property,any *value)

{
  int iVar1;
  ostream *poVar2;
  void *pvVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Person\'s ",9);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(property->_M_dataplus)._M_p,property->_M_string_length)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," has been changed to ",0x15);
  iVar1 = std::__cxx11::string::compare((char *)property);
  if (iVar1 == 0) {
    pvVar3 = std::__any_caster<unsigned_long>(value);
    if (pvVar3 == (void *)0x0) {
      std::__throw_bad_any_cast();
    }
    std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  return;
}

Assistant:

void person_changed(Person&, const std::string& property, const std::any& value) override
	{
		std::cout << "Person's " << property << " has been changed to ";
		if(property == "age")
		{
			std::cout << std::any_cast<size_t>(value);
		}

		std::cout << std::endl;
	}